

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
Clasp::DimacsReader::parseAtLeastK(DimacsReader *this,WeightLitVec *scratch,int64_t maxV)

{
  int iVar1;
  bool bVar2;
  BufferedStream *pBVar3;
  bool cnd;
  int64 lit;
  int64 k;
  long local_50;
  pair<Clasp::Literal,_int> local_48;
  int64_t local_40;
  weight_t local_38;
  undefined4 uStack_34;
  
  (scratch->ebo_).size = 0;
  pBVar3 = Potassco::ProgramReader::stream((ProgramReader *)this);
  bVar2 = Potassco::BufferedStream::match(pBVar3,(int64_t *)&local_38,false);
  Potassco::ProgramReader::require
            ((ProgramReader *)this,CONCAT44(uStack_34,local_38) >> 0x1f == 0 && bVar2,
             "invalid at-least-k constraint");
  local_40 = maxV;
  while( true ) {
    pBVar3 = Potassco::ProgramReader::stream((ProgramReader *)this);
    cnd = false;
    bVar2 = Potassco::BufferedStream::match(pBVar3,&local_50,false);
    if (bVar2) {
      cnd = local_50 <= local_40 && SBORROW8(local_50,-maxV) == local_50 + maxV < 0;
    }
    Potassco::ProgramReader::require
              ((ProgramReader *)this,cnd,"invalid variable in at-least-k constraint");
    if (local_50 == 0) break;
    iVar1 = (int)local_50;
    local_48.first.rep_ = iVar1 * -4 + 2;
    if (-1 < iVar1) {
      local_48.first.rep_ = iVar1 * 4;
    }
    local_48.second = 1;
    bk_lib::
    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
    push_back(scratch,&local_48);
  }
  SatBuilder::addConstraint(this->program_,scratch,local_38);
  return;
}

Assistant:

void DimacsReader::parseAtLeastK(WeightLitVec& scratch, int64_t maxV) {
	scratch.clear();
	int64 k;
	require(stream()->match(k) && k >= 0 && k <= CLASP_WEIGHT_T_MAX, "invalid at-least-k constraint");
	for (int64 lit;;) {
		require(stream()->match(lit) && lit >= -maxV && lit <= maxV, "invalid variable in at-least-k constraint");
		if (lit == 0) {
			program_->addConstraint(scratch, static_cast<weight_t>(k));
			return;
		}
		scratch.push_back(WeightLiteral(toLit(static_cast<int32>(lit)), 1));
	}
}